

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O3

int opengv::absolute_pose::modules::gp3p::init(EVP_PKEY_CTX *ctx)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  int in_EAX;
  double *in_RCX;
  double *in_RDX;
  ulong *in_RSI;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  
  auVar109 = ZEXT816(0xc000000000000000);
  auVar39._0_8_ = in_RSI[3] ^ 0x8000000000000000;
  auVar39._8_8_ = 0x8000000000000000;
  uVar1 = vmovlpd_avx(auVar39);
  *(undefined8 *)(ctx + 0x1e00) = uVar1;
  *(ulong *)(ctx + 0x1f80) = *in_RSI;
  auVar40._0_8_ = in_RSI[3] ^ 0x8000000000000000;
  auVar40._8_8_ = 0x8000000000000000;
  uVar1 = vmovlpd_avx(auVar40);
  *(undefined8 *)(ctx + 0x3000) = uVar1;
  *(ulong *)(ctx + 0x3180) = *in_RSI;
  auVar41._0_8_ = in_RSI[3] ^ 0x8000000000000000;
  auVar41._8_8_ = 0x8000000000000000;
  uVar1 = vmovlpd_avx(auVar41);
  *(undefined8 *)(ctx + 0x4e00) = uVar1;
  *(ulong *)(ctx + 0x4f80) = *in_RSI;
  *(double *)(ctx + 0x6300) = ((*in_RDX - in_RDX[3]) + *in_RCX) - in_RCX[3];
  *(double *)(ctx + 0x6a80) = ((*in_RDX - in_RDX[3]) + *in_RCX) - in_RCX[3];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = in_RCX[2];
  auVar42._8_8_ = 0;
  auVar42._0_8_ = in_RCX[5] + in_RCX[5];
  auVar2 = vfmadd231sd_fma(auVar42,auVar109,auVar2);
  *(long *)(ctx + 0x7080) = auVar2._0_8_;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = in_RCX[1];
  auVar43._8_8_ = 0;
  auVar43._0_8_ = in_RCX[4] + in_RCX[4];
  auVar2 = vfmadd231sd_fma(auVar43,auVar109,auVar45);
  *(long *)(ctx + 0x7200) = auVar2._0_8_;
  *(double *)(ctx + 0x7380) = ((*in_RDX - in_RDX[3]) - *in_RCX) + in_RCX[3];
  auVar44._0_8_ = in_RSI[3] ^ 0x8000000000000000;
  auVar44._8_8_ = 0x8000000000000000;
  uVar1 = vmovlpd_avx(auVar44);
  *(undefined8 *)(ctx + 0x7680) = uVar1;
  *(ulong *)(ctx + 0x7800) = *in_RSI;
  auVar45 = ZEXT816(0x4000000000000000);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = in_RCX[1];
  auVar46._8_8_ = 0;
  auVar46._0_8_ = in_RCX[4] * -2.0;
  auVar2 = vfmadd231sd_fma(auVar46,auVar45,auVar3);
  *(long *)(ctx + 0x7980) = auVar2._0_8_;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = in_RCX[2];
  auVar47._8_8_ = 0;
  auVar47._0_8_ = in_RCX[5] + in_RCX[5];
  auVar2 = vfmadd231sd_fma(auVar47,auVar109,auVar4);
  *(long *)(ctx + 0x7b00) = auVar2._0_8_;
  *(double *)(ctx + 0x7e00) = ((in_RCX[3] - *in_RCX) + *in_RDX) - in_RDX[3];
  auVar48._0_8_ = in_RSI[4] ^ 0x8000000000000000;
  auVar48._8_8_ = 0x8000000000000000;
  uVar1 = vmovlpd_avx(auVar48);
  *(undefined8 *)(ctx + 0x1e08) = uVar1;
  *(ulong *)(ctx + 0x1f88) = in_RSI[1];
  auVar49._0_8_ = in_RSI[4] ^ 0x8000000000000000;
  auVar49._8_8_ = 0x8000000000000000;
  uVar1 = vmovlpd_avx(auVar49);
  *(undefined8 *)(ctx + 0x3008) = uVar1;
  *(ulong *)(ctx + 0x3188) = in_RSI[1];
  auVar50._0_8_ = in_RSI[4] ^ 0x8000000000000000;
  auVar50._8_8_ = 0x8000000000000000;
  uVar1 = vmovlpd_avx(auVar50);
  *(undefined8 *)(ctx + 0x4e08) = uVar1;
  *(ulong *)(ctx + 0x4f88) = in_RSI[1];
  *(double *)(ctx + 0x6308) = ((in_RDX[1] - in_RDX[4]) + in_RCX[1]) - in_RCX[4];
  auVar5._8_8_ = 0;
  auVar5._0_8_ = in_RCX[2];
  auVar51._8_8_ = 0;
  auVar51._0_8_ = in_RCX[5] + in_RCX[5];
  auVar2 = vfmadd231sd_fma(auVar51,auVar109,auVar5);
  *(long *)(ctx + 0x6908) = auVar2._0_8_;
  *(double *)(ctx + 0x6a88) = ((in_RDX[1] - in_RDX[4]) - in_RCX[1]) + in_RCX[4];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = in_RCX[3];
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *in_RCX * -2.0;
  auVar2 = vfmadd231sd_fma(auVar52,auVar45,auVar6);
  *(long *)(ctx + 0x7208) = auVar2._0_8_;
  *(double *)(ctx + 0x7388) = ((in_RDX[1] - in_RDX[4]) + in_RCX[1]) - in_RCX[4];
  auVar53._0_8_ = in_RSI[4] ^ 0x8000000000000000;
  auVar53._8_8_ = 0x8000000000000000;
  uVar1 = vmovlpd_avx(auVar53);
  *(undefined8 *)(ctx + 0x7688) = uVar1;
  *(ulong *)(ctx + 0x7808) = in_RSI[1];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *in_RCX;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = in_RCX[3] + in_RCX[3];
  auVar2 = vfmadd231sd_fma(auVar54,auVar109,auVar7);
  *(long *)(ctx + 0x7988) = auVar2._0_8_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = in_RCX[2];
  auVar55._8_8_ = 0;
  auVar55._0_8_ = in_RCX[5] * -2.0;
  auVar2 = vfmadd231sd_fma(auVar55,auVar45,auVar8);
  *(long *)(ctx + 0x7c88) = auVar2._0_8_;
  *(double *)(ctx + 0x7e08) = ((in_RCX[4] - in_RCX[1]) + in_RDX[1]) - in_RDX[4];
  auVar56._0_8_ = in_RSI[5] ^ 0x8000000000000000;
  auVar56._8_8_ = 0x8000000000000000;
  uVar1 = vmovlpd_avx(auVar56);
  *(undefined8 *)(ctx + 0x1e10) = uVar1;
  *(ulong *)(ctx + 0x1f90) = in_RSI[2];
  auVar57._0_8_ = in_RSI[5] ^ 0x8000000000000000;
  auVar57._8_8_ = 0x8000000000000000;
  uVar1 = vmovlpd_avx(auVar57);
  *(undefined8 *)(ctx + 0x3010) = uVar1;
  *(ulong *)(ctx + 0x3190) = in_RSI[2];
  auVar58._0_8_ = in_RSI[5] ^ 0x8000000000000000;
  auVar58._8_8_ = 0x8000000000000000;
  uVar1 = vmovlpd_avx(auVar58);
  *(undefined8 *)(ctx + 0x4e10) = uVar1;
  *(ulong *)(ctx + 0x4f90) = in_RSI[2];
  *(double *)(ctx + 0x6310) = ((in_RDX[2] - in_RDX[5]) - in_RCX[2]) + in_RCX[5];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = in_RCX[1];
  auVar59._8_8_ = 0;
  auVar59._0_8_ = in_RCX[4] + in_RCX[4];
  auVar2 = vfmadd231sd_fma(auVar59,auVar109,auVar9);
  *(long *)(ctx + 0x6910) = auVar2._0_8_;
  *(double *)(ctx + 0x6a90) = ((in_RDX[2] - in_RDX[5]) + in_RCX[2]) - in_RCX[5];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *in_RCX;
  auVar60._8_8_ = 0;
  auVar60._0_8_ = in_RCX[3] + in_RCX[3];
  auVar2 = vfmadd231sd_fma(auVar60,auVar109,auVar10);
  *(long *)(ctx + 0x7090) = auVar2._0_8_;
  *(double *)(ctx + 0x7390) = ((in_RDX[2] - in_RDX[5]) + in_RCX[2]) - in_RCX[5];
  auVar61._0_8_ = in_RSI[5] ^ 0x8000000000000000;
  auVar61._8_8_ = 0x8000000000000000;
  uVar1 = vmovlpd_avx(auVar61);
  *(undefined8 *)(ctx + 0x7690) = uVar1;
  *(ulong *)(ctx + 0x7810) = in_RSI[2];
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *in_RCX;
  auVar62._8_8_ = 0;
  auVar62._0_8_ = in_RCX[3] * -2.0;
  auVar2 = vfmadd231sd_fma(auVar62,auVar45,auVar11);
  *(long *)(ctx + 0x7b10) = auVar2._0_8_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = in_RCX[1];
  auVar63._8_8_ = 0;
  auVar63._0_8_ = in_RCX[4] + in_RCX[4];
  auVar2 = vfmadd231sd_fma(auVar63,auVar109,auVar12);
  *(long *)(ctx + 0x7c90) = auVar2._0_8_;
  *(double *)(ctx + 0x7e10) = ((in_RCX[5] - in_RCX[2]) + in_RDX[2]) - in_RDX[5];
  auVar64._0_8_ = in_RSI[6] ^ 0x8000000000000000;
  auVar64._8_8_ = 0x8000000000000000;
  uVar1 = vmovlpd_avx(auVar64);
  *(undefined8 *)(ctx + 0x1c98) = uVar1;
  *(ulong *)(ctx + 0x1e18) = in_RSI[3];
  auVar65._0_8_ = in_RSI[6] ^ 0x8000000000000000;
  auVar65._8_8_ = 0x8000000000000000;
  uVar1 = vmovlpd_avx(auVar65);
  *(undefined8 *)(ctx + 0x2e98) = uVar1;
  *(ulong *)(ctx + 0x3018) = in_RSI[3];
  auVar66._0_8_ = in_RSI[6] ^ 0x8000000000000000;
  auVar66._8_8_ = 0x8000000000000000;
  uVar1 = vmovlpd_avx(auVar66);
  *(undefined8 *)(ctx + 0x4c98) = uVar1;
  *(ulong *)(ctx + 0x4e18) = in_RSI[3];
  *(double *)(ctx + 0x6318) = ((in_RDX[3] + in_RCX[3]) - in_RDX[6]) - in_RCX[6];
  *(double *)(ctx + 0x6a98) = ((in_RDX[3] + in_RCX[3]) - in_RDX[6]) - in_RCX[6];
  auVar13._8_8_ = 0;
  auVar13._0_8_ = in_RCX[5];
  auVar67._8_8_ = 0;
  auVar67._0_8_ = in_RCX[8] + in_RCX[8];
  auVar2 = vfmadd231sd_fma(auVar67,auVar109,auVar13);
  *(long *)(ctx + 0x7098) = auVar2._0_8_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = in_RCX[4];
  auVar68._8_8_ = 0;
  auVar68._0_8_ = in_RCX[7] + in_RCX[7];
  auVar2 = vfmadd231sd_fma(auVar68,auVar109,auVar14);
  *(long *)(ctx + 0x7218) = auVar2._0_8_;
  *(double *)(ctx + 0x7398) = ((in_RDX[3] - in_RCX[3]) - in_RDX[6]) + in_RCX[6];
  auVar69._0_8_ = in_RSI[6] ^ 0x8000000000000000;
  auVar69._8_8_ = 0x8000000000000000;
  uVar1 = vmovlpd_avx(auVar69);
  *(undefined8 *)(ctx + 0x7518) = uVar1;
  *(ulong *)(ctx + 0x7698) = in_RSI[3];
  auVar15._8_8_ = 0;
  auVar15._0_8_ = in_RCX[4];
  auVar70._8_8_ = 0;
  auVar70._0_8_ = in_RCX[7] * -2.0;
  auVar2 = vfmadd231sd_fma(auVar70,auVar45,auVar15);
  *(long *)(ctx + 0x7998) = auVar2._0_8_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = in_RCX[5];
  auVar71._8_8_ = 0;
  auVar71._0_8_ = in_RCX[8] + in_RCX[8];
  auVar2 = vfmadd231sd_fma(auVar71,auVar109,auVar16);
  *(long *)(ctx + 0x7b18) = auVar2._0_8_;
  *(double *)(ctx + 0x7e18) = ((in_RCX[6] - in_RCX[3]) - in_RDX[6]) + in_RDX[3];
  auVar72._0_8_ = in_RSI[7] ^ 0x8000000000000000;
  auVar72._8_8_ = 0x8000000000000000;
  uVar1 = vmovlpd_avx(auVar72);
  *(undefined8 *)(ctx + 0x1ca0) = uVar1;
  *(ulong *)(ctx + 0x1e20) = in_RSI[4];
  auVar73._0_8_ = in_RSI[7] ^ 0x8000000000000000;
  auVar73._8_8_ = 0x8000000000000000;
  uVar1 = vmovlpd_avx(auVar73);
  *(undefined8 *)(ctx + 0x2ea0) = uVar1;
  *(ulong *)(ctx + 0x3020) = in_RSI[4];
  auVar74._0_8_ = in_RSI[7] ^ 0x8000000000000000;
  auVar74._8_8_ = 0x8000000000000000;
  uVar1 = vmovlpd_avx(auVar74);
  *(undefined8 *)(ctx + 0x4ca0) = uVar1;
  *(ulong *)(ctx + 20000) = in_RSI[4];
  *(double *)(ctx + 0x6320) = ((in_RDX[4] + in_RCX[4]) - in_RDX[7]) - in_RCX[7];
  auVar17._8_8_ = 0;
  auVar17._0_8_ = in_RCX[8];
  auVar75._8_8_ = 0;
  auVar75._0_8_ = in_RCX[5] * -2.0;
  auVar2 = vfmadd231sd_fma(auVar75,auVar45,auVar17);
  *(long *)(ctx + 0x6920) = auVar2._0_8_;
  *(double *)(ctx + 0x6aa0) = ((in_RDX[4] - in_RCX[4]) - in_RDX[7]) + in_RCX[7];
  auVar18._8_8_ = 0;
  auVar18._0_8_ = in_RCX[3];
  auVar76._8_8_ = 0;
  auVar76._0_8_ = in_RCX[6] + in_RCX[6];
  auVar2 = vfmadd231sd_fma(auVar76,auVar109,auVar18);
  *(long *)(ctx + 0x7220) = auVar2._0_8_;
  *(double *)(ctx + 0x73a0) = ((in_RDX[4] + in_RCX[4]) - in_RDX[7]) - in_RCX[7];
  auVar77._0_8_ = in_RSI[7] ^ 0x8000000000000000;
  auVar77._8_8_ = 0x8000000000000000;
  uVar1 = vmovlpd_avx(auVar77);
  *(undefined8 *)(ctx + 0x7520) = uVar1;
  *(ulong *)(ctx + 0x76a0) = in_RSI[4];
  auVar19._8_8_ = 0;
  auVar19._0_8_ = in_RCX[3];
  auVar78._8_8_ = 0;
  auVar78._0_8_ = in_RCX[6] + in_RCX[6];
  auVar2 = vfmadd231sd_fma(auVar78,auVar109,auVar19);
  *(long *)(ctx + 0x79a0) = auVar2._0_8_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = in_RCX[5];
  auVar79._8_8_ = 0;
  auVar79._0_8_ = in_RCX[8] * -2.0;
  auVar2 = vfmadd231sd_fma(auVar79,auVar45,auVar20);
  *(long *)(ctx + 0x7ca0) = auVar2._0_8_;
  *(double *)(ctx + 0x7e20) = ((in_RCX[7] - in_RCX[4]) - in_RDX[7]) + in_RDX[4];
  auVar80._0_8_ = in_RSI[8] ^ 0x8000000000000000;
  auVar80._8_8_ = 0x8000000000000000;
  uVar1 = vmovlpd_avx(auVar80);
  *(undefined8 *)(ctx + 0x1ca8) = uVar1;
  *(ulong *)(ctx + 0x1e28) = in_RSI[5];
  auVar81._0_8_ = in_RSI[8] ^ 0x8000000000000000;
  auVar81._8_8_ = 0x8000000000000000;
  uVar1 = vmovlpd_avx(auVar81);
  *(undefined8 *)(ctx + 0x2ea8) = uVar1;
  *(ulong *)(ctx + 0x3028) = in_RSI[5];
  auVar82._0_8_ = in_RSI[8] ^ 0x8000000000000000;
  auVar82._8_8_ = 0x8000000000000000;
  uVar1 = vmovlpd_avx(auVar82);
  *(undefined8 *)(ctx + 0x4ca8) = uVar1;
  *(ulong *)(ctx + 0x4e28) = in_RSI[5];
  *(double *)(ctx + 0x6328) = ((in_RDX[5] - in_RCX[5]) - in_RDX[8]) + in_RCX[8];
  auVar21._8_8_ = 0;
  auVar21._0_8_ = in_RCX[4];
  auVar83._8_8_ = 0;
  auVar83._0_8_ = in_RCX[7] + in_RCX[7];
  auVar2 = vfmadd231sd_fma(auVar83,auVar109,auVar21);
  *(long *)(ctx + 0x6928) = auVar2._0_8_;
  *(double *)(ctx + 0x6aa8) = ((in_RDX[5] + in_RCX[5]) - in_RDX[8]) - in_RCX[8];
  auVar22._8_8_ = 0;
  auVar22._0_8_ = in_RCX[3];
  auVar84._8_8_ = 0;
  auVar84._0_8_ = in_RCX[6] + in_RCX[6];
  auVar2 = vfmadd231sd_fma(auVar84,auVar109,auVar22);
  *(long *)(ctx + 0x70a8) = auVar2._0_8_;
  *(double *)(ctx + 0x73a8) = ((in_RDX[5] + in_RCX[5]) - in_RDX[8]) - in_RCX[8];
  auVar85._0_8_ = in_RSI[8] ^ 0x8000000000000000;
  auVar85._8_8_ = 0x8000000000000000;
  uVar1 = vmovlpd_avx(auVar85);
  *(undefined8 *)(ctx + 0x7528) = uVar1;
  *(ulong *)(ctx + 0x76a8) = in_RSI[5];
  auVar23._8_8_ = 0;
  auVar23._0_8_ = in_RCX[3];
  auVar86._8_8_ = 0;
  auVar86._0_8_ = in_RCX[6] * -2.0;
  auVar2 = vfmadd231sd_fma(auVar86,auVar45,auVar23);
  *(long *)(ctx + 0x7b28) = auVar2._0_8_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = in_RCX[4];
  auVar87._8_8_ = 0;
  auVar87._0_8_ = in_RCX[7] + in_RCX[7];
  auVar2 = vfmadd231sd_fma(auVar87,auVar109,auVar24);
  *(long *)(ctx + 0x7ca8) = auVar2._0_8_;
  *(double *)(ctx + 0x7e28) = ((in_RCX[8] - in_RCX[5]) - in_RDX[8]) + in_RDX[5];
  *(ulong *)(ctx + 0x1cb0) = in_RSI[6];
  auVar88._0_8_ = *in_RSI ^ 0x8000000000000000;
  auVar88._8_8_ = 0x8000000000000000;
  uVar1 = vmovlpd_avx(auVar88);
  *(undefined8 *)(ctx + 0x1fb0) = uVar1;
  *(ulong *)(ctx + 0x2eb0) = in_RSI[6];
  auVar89._0_8_ = *in_RSI ^ 0x8000000000000000;
  auVar89._8_8_ = 0x8000000000000000;
  uVar1 = vmovlpd_avx(auVar89);
  *(undefined8 *)(ctx + 0x31b0) = uVar1;
  *(ulong *)(ctx + 0x4cb0) = in_RSI[6];
  auVar90._0_8_ = *in_RSI ^ 0x8000000000000000;
  auVar90._8_8_ = 0x8000000000000000;
  uVar1 = vmovlpd_avx(auVar90);
  *(undefined8 *)(ctx + 0x4fb0) = uVar1;
  *(double *)(ctx + 0x6330) = (-*in_RDX - *in_RCX) + in_RDX[6] + in_RCX[6];
  *(double *)(ctx + 0x6ab0) = (-*in_RDX - *in_RCX) + in_RDX[6] + in_RCX[6];
  auVar25._8_8_ = 0;
  auVar25._0_8_ = in_RCX[2];
  auVar91._8_8_ = 0;
  auVar91._0_8_ = in_RCX[8] * -2.0;
  auVar2 = vfmadd231sd_fma(auVar91,auVar45,auVar25);
  *(long *)(ctx + 0x70b0) = auVar2._0_8_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = in_RCX[1];
  auVar92._8_8_ = 0;
  auVar92._0_8_ = in_RCX[7] * -2.0;
  auVar2 = vfmadd231sd_fma(auVar92,auVar45,auVar26);
  *(long *)(ctx + 0x7230) = auVar2._0_8_;
  *(double *)(ctx + 0x73b0) = ((*in_RCX - *in_RDX) + in_RDX[6]) - in_RCX[6];
  *(ulong *)(ctx + 30000) = in_RSI[6];
  auVar93._0_8_ = *in_RSI ^ 0x8000000000000000;
  auVar93._8_8_ = 0x8000000000000000;
  uVar1 = vmovlpd_avx(auVar93);
  *(undefined8 *)(ctx + 0x7830) = uVar1;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = in_RCX[1];
  auVar94._8_8_ = 0;
  auVar94._0_8_ = in_RCX[7] + in_RCX[7];
  auVar2 = vfmadd231sd_fma(auVar94,auVar109,auVar27);
  *(long *)(ctx + 0x79b0) = auVar2._0_8_;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = in_RCX[2];
  auVar95._8_8_ = 0;
  auVar95._0_8_ = in_RCX[8] * -2.0;
  auVar2 = vfmadd231sd_fma(auVar95,auVar45,auVar28);
  *(long *)(ctx + 0x7b30) = auVar2._0_8_;
  *(double *)(ctx + 0x7e30) = ((*in_RCX - in_RCX[6]) - *in_RDX) + in_RDX[6];
  *(ulong *)(ctx + 0x1cb8) = in_RSI[7];
  auVar96._0_8_ = in_RSI[1] ^ 0x8000000000000000;
  auVar96._8_8_ = 0x8000000000000000;
  uVar1 = vmovlpd_avx(auVar96);
  *(undefined8 *)(ctx + 0x1fb8) = uVar1;
  *(ulong *)(ctx + 0x2eb8) = in_RSI[7];
  auVar97._0_8_ = in_RSI[1] ^ 0x8000000000000000;
  auVar97._8_8_ = 0x8000000000000000;
  uVar1 = vmovlpd_avx(auVar97);
  *(undefined8 *)(ctx + 0x31b8) = uVar1;
  *(ulong *)(ctx + 0x4cb8) = in_RSI[7];
  auVar98._0_8_ = in_RSI[1] ^ 0x8000000000000000;
  auVar98._8_8_ = 0x8000000000000000;
  uVar1 = vmovlpd_avx(auVar98);
  *(undefined8 *)(ctx + 0x4fb8) = uVar1;
  *(double *)(ctx + 0x6338) = (-in_RDX[1] - in_RCX[1]) + in_RDX[7] + in_RCX[7];
  auVar29._8_8_ = 0;
  auVar29._0_8_ = in_RCX[8];
  auVar99._8_8_ = 0;
  auVar99._0_8_ = in_RCX[2] + in_RCX[2];
  auVar2 = vfmadd231sd_fma(auVar99,auVar109,auVar29);
  *(long *)(ctx + 0x6938) = auVar2._0_8_;
  *(double *)(ctx + 0x6ab8) = ((in_RCX[1] - in_RDX[1]) + in_RDX[7]) - in_RCX[7];
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *in_RCX;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = in_RCX[6] * -2.0;
  auVar2 = vfmadd231sd_fma(auVar100,auVar45,auVar30);
  *(long *)(ctx + 0x7238) = auVar2._0_8_;
  *(double *)(ctx + 0x73b8) = (-in_RDX[1] - in_RCX[1]) + in_RDX[7] + in_RCX[7];
  *(ulong *)(ctx + 0x7538) = in_RSI[7];
  auVar101._0_8_ = in_RSI[1] ^ 0x8000000000000000;
  auVar101._8_8_ = 0x8000000000000000;
  uVar1 = vmovlpd_avx(auVar101);
  *(undefined8 *)(ctx + 0x7838) = uVar1;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *in_RCX;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = in_RCX[6] * -2.0;
  auVar2 = vfmadd231sd_fma(auVar102,auVar45,auVar31);
  *(long *)(ctx + 0x79b8) = auVar2._0_8_;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = in_RCX[2];
  auVar103._8_8_ = 0;
  auVar103._0_8_ = in_RCX[8] + in_RCX[8];
  auVar2 = vfmadd231sd_fma(auVar103,auVar109,auVar32);
  *(long *)(ctx + 0x7cb8) = auVar2._0_8_;
  *(double *)(ctx + 0x7e38) = ((in_RCX[1] - in_RCX[7]) - in_RDX[1]) + in_RDX[7];
  *(ulong *)(ctx + 0x1cc0) = in_RSI[8];
  auVar104._0_8_ = in_RSI[2] ^ 0x8000000000000000;
  auVar104._8_8_ = 0x8000000000000000;
  uVar1 = vmovlpd_avx(auVar104);
  *(undefined8 *)(ctx + 0x1fc0) = uVar1;
  *(ulong *)(ctx + 0x2ec0) = in_RSI[8];
  auVar105._0_8_ = in_RSI[2] ^ 0x8000000000000000;
  auVar105._8_8_ = 0x8000000000000000;
  uVar1 = vmovlpd_avx(auVar105);
  *(undefined8 *)(ctx + 0x31c0) = uVar1;
  *(ulong *)(ctx + 0x4cc0) = in_RSI[8];
  auVar106._0_8_ = in_RSI[2] ^ 0x8000000000000000;
  auVar106._8_8_ = 0x8000000000000000;
  uVar1 = vmovlpd_avx(auVar106);
  *(undefined8 *)(ctx + 0x4fc0) = uVar1;
  *(double *)(ctx + 0x6340) = ((in_RCX[2] - in_RDX[2]) + in_RDX[8]) - in_RCX[8];
  auVar33._8_8_ = 0;
  auVar33._0_8_ = in_RCX[1];
  auVar107._8_8_ = 0;
  auVar107._0_8_ = in_RCX[7] * -2.0;
  auVar2 = vfmadd231sd_fma(auVar107,auVar45,auVar33);
  *(long *)(ctx + 0x6940) = auVar2._0_8_;
  *(double *)(ctx + 0x6ac0) = (-in_RDX[2] - in_RCX[2]) + in_RDX[8] + in_RCX[8];
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *in_RCX;
  auVar108._8_8_ = 0;
  auVar108._0_8_ = in_RCX[6] * -2.0;
  auVar2 = vfmadd231sd_fma(auVar108,auVar45,auVar34);
  *(long *)(ctx + 0x70c0) = auVar2._0_8_;
  *(double *)(ctx + 0x73c0) = (-in_RDX[2] - in_RCX[2]) + in_RDX[8] + in_RCX[8];
  *(ulong *)(ctx + 0x7540) = in_RSI[8];
  auVar36._0_8_ = in_RSI[2] ^ 0x8000000000000000;
  auVar36._8_8_ = 0x8000000000000000;
  uVar1 = vmovlpd_avx(auVar36);
  *(undefined8 *)(ctx + 0x7840) = uVar1;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *in_RCX;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = in_RCX[6] + in_RCX[6];
  auVar2 = vfmadd231sd_fma(auVar37,auVar109,auVar35);
  *(long *)(ctx + 0x7b40) = auVar2._0_8_;
  auVar109._8_8_ = 0;
  auVar109._0_8_ = in_RCX[1];
  auVar38._8_8_ = 0;
  auVar38._0_8_ = in_RCX[7] * -2.0;
  auVar2 = vfmadd231sd_fma(auVar38,auVar45,auVar109);
  *(long *)(ctx + 0x7cc0) = auVar2._0_8_;
  *(double *)(ctx + 0x7e40) = ((in_RCX[2] - in_RCX[8]) - in_RDX[2]) + in_RDX[8];
  return in_EAX;
}

Assistant:

void
opengv::absolute_pose::modules::gp3p::init(
    Eigen::Matrix<double,48,85> & groebnerMatrix,
    const Eigen::Matrix<double,3,3> & f,
    const Eigen::Matrix<double,3,3> & v,
    const Eigen::Matrix<double,3,3> & p )
{
  groebnerMatrix(0,20) = -1*f(0,1);
  groebnerMatrix(0,21) = f(0,0);
  groebnerMatrix(0,32) = -1*f(0,1);
  groebnerMatrix(0,33) = f(0,0);
  groebnerMatrix(0,52) = -1*f(0,1);
  groebnerMatrix(0,53) = f(0,0);
  groebnerMatrix(0,66) = (((v(0,0)-v(0,1))+p(0,0))-p(0,1));
  groebnerMatrix(0,71) = (((v(0,0)-v(0,1))+p(0,0))-p(0,1));
  groebnerMatrix(0,75) = (-2*p(2,0)+2*p(2,1));
  groebnerMatrix(0,76) = (-2*p(1,0)+2*p(1,1));
  groebnerMatrix(0,77) = (((v(0,0)-v(0,1))-p(0,0))+p(0,1));
  groebnerMatrix(0,79) = -1*f(0,1);
  groebnerMatrix(0,80) = f(0,0);
  groebnerMatrix(0,81) = (2*p(1,0)-2*p(1,1));
  groebnerMatrix(0,82) = (-2*p(2,0)+2*p(2,1));
  groebnerMatrix(0,84) = (((-p(0,0)+p(0,1))+v(0,0))-v(0,1));
  groebnerMatrix(1,20) = -1*f(1,1);
  groebnerMatrix(1,21) = f(1,0);
  groebnerMatrix(1,32) = -1*f(1,1);
  groebnerMatrix(1,33) = f(1,0);
  groebnerMatrix(1,52) = -1*f(1,1);
  groebnerMatrix(1,53) = f(1,0);
  groebnerMatrix(1,66) = (((v(1,0)-v(1,1))+p(1,0))-p(1,1));
  groebnerMatrix(1,70) = (-2*p(2,0)+2*p(2,1));
  groebnerMatrix(1,71) = (((v(1,0)-v(1,1))-p(1,0))+p(1,1));
  groebnerMatrix(1,76) = (2*p(0,1)-2*p(0,0));
  groebnerMatrix(1,77) = (((v(1,0)-v(1,1))+p(1,0))-p(1,1));
  groebnerMatrix(1,79) = -1*f(1,1);
  groebnerMatrix(1,80) = f(1,0);
  groebnerMatrix(1,81) = (-2*p(0,0)+2*p(0,1));
  groebnerMatrix(1,83) = (2*p(2,0)-2*p(2,1));
  groebnerMatrix(1,84) = (((-p(1,0)+p(1,1))+v(1,0))-v(1,1));
  groebnerMatrix(2,20) = -1*f(2,1);
  groebnerMatrix(2,21) = f(2,0);
  groebnerMatrix(2,32) = -1*f(2,1);
  groebnerMatrix(2,33) = f(2,0);
  groebnerMatrix(2,52) = -1*f(2,1);
  groebnerMatrix(2,53) = f(2,0);
  groebnerMatrix(2,66) = (((v(2,0)-v(2,1))-p(2,0))+p(2,1));
  groebnerMatrix(2,70) = (-2*p(1,0)+2*p(1,1));
  groebnerMatrix(2,71) = (((v(2,0)-v(2,1))+p(2,0))-p(2,1));
  groebnerMatrix(2,75) = (-2*p(0,0)+2*p(0,1));
  groebnerMatrix(2,77) = (((v(2,0)-v(2,1))+p(2,0))-p(2,1));
  groebnerMatrix(2,79) = -1*f(2,1);
  groebnerMatrix(2,80) = f(2,0);
  groebnerMatrix(2,82) = (2*p(0,0)-2*p(0,1));
  groebnerMatrix(2,83) = (-2*p(1,0)+2*p(1,1));
  groebnerMatrix(2,84) = (((-p(2,0)+p(2,1))+v(2,0))-v(2,1));
  groebnerMatrix(3,19) = -1*f(0,2);
  groebnerMatrix(3,20) = f(0,1);
  groebnerMatrix(3,31) = -1*f(0,2);
  groebnerMatrix(3,32) = f(0,1);
  groebnerMatrix(3,51) = -1*f(0,2);
  groebnerMatrix(3,52) = f(0,1);
  groebnerMatrix(3,66) = (((v(0,1)+p(0,1))-v(0,2))-p(0,2));
  groebnerMatrix(3,71) = (((v(0,1)+p(0,1))-v(0,2))-p(0,2));
  groebnerMatrix(3,75) = (-2*p(2,1)+2*p(2,2));
  groebnerMatrix(3,76) = (-2*p(1,1)+2*p(1,2));
  groebnerMatrix(3,77) = (((v(0,1)-p(0,1))-v(0,2))+p(0,2));
  groebnerMatrix(3,78) = -1*f(0,2);
  groebnerMatrix(3,79) = f(0,1);
  groebnerMatrix(3,81) = (2*p(1,1)-2*p(1,2));
  groebnerMatrix(3,82) = (-2*p(2,1)+2*p(2,2));
  groebnerMatrix(3,84) = (((-p(0,1)+p(0,2))-v(0,2))+v(0,1));
  groebnerMatrix(4,19) = -1*f(1,2);
  groebnerMatrix(4,20) = f(1,1);
  groebnerMatrix(4,31) = -1*f(1,2);
  groebnerMatrix(4,32) = f(1,1);
  groebnerMatrix(4,51) = -1*f(1,2);
  groebnerMatrix(4,52) = f(1,1);
  groebnerMatrix(4,66) = (((v(1,1)+p(1,1))-v(1,2))-p(1,2));
  groebnerMatrix(4,70) = (2*p(2,2)-2*p(2,1));
  groebnerMatrix(4,71) = (((v(1,1)-p(1,1))-v(1,2))+p(1,2));
  groebnerMatrix(4,76) = (-2*p(0,1)+2*p(0,2));
  groebnerMatrix(4,77) = (((v(1,1)+p(1,1))-v(1,2))-p(1,2));
  groebnerMatrix(4,78) = -1*f(1,2);
  groebnerMatrix(4,79) = f(1,1);
  groebnerMatrix(4,81) = (-2*p(0,1)+2*p(0,2));
  groebnerMatrix(4,83) = (2*p(2,1)-2*p(2,2));
  groebnerMatrix(4,84) = (((-p(1,1)+p(1,2))-v(1,2))+v(1,1));
  groebnerMatrix(5,19) = -1*f(2,2);
  groebnerMatrix(5,20) = f(2,1);
  groebnerMatrix(5,31) = -1*f(2,2);
  groebnerMatrix(5,32) = f(2,1);
  groebnerMatrix(5,51) = -1*f(2,2);
  groebnerMatrix(5,52) = f(2,1);
  groebnerMatrix(5,66) = (((v(2,1)-p(2,1))-v(2,2))+p(2,2));
  groebnerMatrix(5,70) = (-2*p(1,1)+2*p(1,2));
  groebnerMatrix(5,71) = (((v(2,1)+p(2,1))-v(2,2))-p(2,2));
  groebnerMatrix(5,75) = (-2*p(0,1)+2*p(0,2));
  groebnerMatrix(5,77) = (((v(2,1)+p(2,1))-v(2,2))-p(2,2));
  groebnerMatrix(5,78) = -1*f(2,2);
  groebnerMatrix(5,79) = f(2,1);
  groebnerMatrix(5,82) = (2*p(0,1)-2*p(0,2));
  groebnerMatrix(5,83) = (-2*p(1,1)+2*p(1,2));
  groebnerMatrix(5,84) = (((-p(2,1)+p(2,2))-v(2,2))+v(2,1));
  groebnerMatrix(6,19) = f(0,2);
  groebnerMatrix(6,21) = -1*f(0,0);
  groebnerMatrix(6,31) = f(0,2);
  groebnerMatrix(6,33) = -1*f(0,0);
  groebnerMatrix(6,51) = f(0,2);
  groebnerMatrix(6,53) = -1*f(0,0);
  groebnerMatrix(6,66) = (((-v(0,0)-p(0,0))+v(0,2))+p(0,2));
  groebnerMatrix(6,71) = (((-v(0,0)-p(0,0))+v(0,2))+p(0,2));
  groebnerMatrix(6,75) = (2*p(2,0)-2*p(2,2));
  groebnerMatrix(6,76) = (2*p(1,0)-2*p(1,2));
  groebnerMatrix(6,77) = (((-v(0,0)+p(0,0))+v(0,2))-p(0,2));
  groebnerMatrix(6,78) = f(0,2);
  groebnerMatrix(6,80) = -1*f(0,0);
  groebnerMatrix(6,81) = (-2*p(1,0)+2*p(1,2));
  groebnerMatrix(6,82) = (2*p(2,0)-2*p(2,2));
  groebnerMatrix(6,84) = (((p(0,0)-p(0,2))-v(0,0))+v(0,2));
  groebnerMatrix(7,19) = f(1,2);
  groebnerMatrix(7,21) = -1*f(1,0);
  groebnerMatrix(7,31) = f(1,2);
  groebnerMatrix(7,33) = -1*f(1,0);
  groebnerMatrix(7,51) = f(1,2);
  groebnerMatrix(7,53) = -1*f(1,0);
  groebnerMatrix(7,66) = (((-v(1,0)-p(1,0))+v(1,2))+p(1,2));
  groebnerMatrix(7,70) = (-2*p(2,2)+2*p(2,0));
  groebnerMatrix(7,71) = (((-v(1,0)+p(1,0))+v(1,2))-p(1,2));
  groebnerMatrix(7,76) = (2*p(0,0)-2*p(0,2));
  groebnerMatrix(7,77) = (((-v(1,0)-p(1,0))+v(1,2))+p(1,2));
  groebnerMatrix(7,78) = f(1,2);
  groebnerMatrix(7,80) = -1*f(1,0);
  groebnerMatrix(7,81) = (2*p(0,0)-2*p(0,2));
  groebnerMatrix(7,83) = (-2*p(2,0)+2*p(2,2));
  groebnerMatrix(7,84) = (((p(1,0)-p(1,2))-v(1,0))+v(1,2));
  groebnerMatrix(8,19) = f(2,2);
  groebnerMatrix(8,21) = -1*f(2,0);
  groebnerMatrix(8,31) = f(2,2);
  groebnerMatrix(8,33) = -1*f(2,0);
  groebnerMatrix(8,51) = f(2,2);
  groebnerMatrix(8,53) = -1*f(2,0);
  groebnerMatrix(8,66) = (((-v(2,0)+p(2,0))+v(2,2))-p(2,2));
  groebnerMatrix(8,70) = (2*p(1,0)-2*p(1,2));
  groebnerMatrix(8,71) = (((-v(2,0)-p(2,0))+v(2,2))+p(2,2));
  groebnerMatrix(8,75) = (2*p(0,0)-2*p(0,2));
  groebnerMatrix(8,77) = (((-v(2,0)-p(2,0))+v(2,2))+p(2,2));
  groebnerMatrix(8,78) = f(2,2);
  groebnerMatrix(8,80) = -1*f(2,0);
  groebnerMatrix(8,82) = (-2*p(0,0)+2*p(0,2));
  groebnerMatrix(8,83) = (2*p(1,0)-2*p(1,2));
  groebnerMatrix(8,84) = (((p(2,0)-p(2,2))-v(2,0))+v(2,2));
}